

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O2

void __thiscall pool_tests::random_allocations::test_method(random_allocations *this)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  pointer __p;
  pointer pPVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  byte bVar7;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  iterator __begin1;
  pointer this_00;
  iterator __end1;
  undefined1 *puVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long lVar11;
  pointer pPVar12;
  FastRandomContext *this_01;
  pointer pPVar13;
  size_t __n_00;
  pointer pPVar14;
  long in_FS_OFFSET;
  bool bVar15;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char **local_160;
  assertion_result local_158;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  void *ptr;
  vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> local_118;
  binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
  local_100;
  PoolResource<128UL,_8UL> resource;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<128UL,_8UL>::PoolResource(&resource,0x10000);
  this_01 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 1000;
  pPVar14 = (pointer)0x0;
  this_00 = (pointer)0x0;
LAB_0043b2e5:
  do {
    bVar15 = lVar11 == 0;
    lVar11 = lVar11 + -1;
    if (bVar15) {
      local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
      super__Vector_impl_data._M_start = this_00;
      local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
      super__Vector_impl_data._M_finish = pPVar14;
      for (; this_00 != pPVar14; this_00 = this_00 + 1) {
        PoolResource<128UL,_8UL>::Deallocate
                  (&resource,(((_Vector_impl *)&this_00->ptr)->super__Vector_impl_data)._M_start,
                   (size_t)this_00->bytes,(size_t)this_00->alignment);
      }
      PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(&resource);
      std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::~vector(&local_118);
      PoolResource<128UL,_8UL>::~PoolResource(&resource);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0043b829:
      __stack_chk_fail();
    }
    if (this_00 == pPVar14) {
LAB_0043b307:
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        (&this_01->super_RandomMixin<FastRandomContext>,8);
      bVar7 = (byte)iVar3;
      pPVar12 = (pointer)(1L << (bVar7 & 0x3f));
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        (&this_01->super_RandomMixin<FastRandomContext>,200);
      pPVar13 = (pointer)(((ulong)(long)iVar3 >> (bVar7 & 0x3f)) + 1 << (bVar7 & 0x3f));
      ptr = PoolResource<128UL,_8UL>::Allocate(&resource,(size_t)pPVar13,(size_t)pPVar12);
      local_130 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_128 = "";
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x89;
      file.m_begin = (iterator)&local_130;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg)
      ;
      local_100.m_lhs.m_value = &ptr;
      local_100.m_rhs = (void *)0x0;
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
      ::evaluate(&local_158,&local_100,false);
      local_188 = "ptr != nullptr";
      local_180 = "";
      local_178.m_empty = false;
      local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
      local_168 = boost::unit_test::lazy_ostream::inst;
      local_160 = &local_188;
      local_198 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_190 = "";
      pvVar9 = &DAT_00000001;
      pvVar10 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_158,&local_178,1,0xe,WARN,(check_type)pPVar14,(size_t)&local_198,0x89);
      boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
      local_1a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_1a0 = "";
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = pvVar10;
      msg_00.m_begin = pvVar9;
      file_00.m_end = (iterator)0x8a;
      file_00.m_begin = (iterator)&local_1a8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
                 msg_00);
      local_100.m_lhs.m_value = (void **)((ulong)((long)&pPVar12[-1].alignment + 7U) & (ulong)ptr);
      local_100.m_rhs = (void *)((ulong)local_100.m_rhs & 0xffffffff00000000);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
      ::evaluate(&local_158,
                 (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
                  *)&local_100,false);
      local_188 = "(reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0";
      local_180 = "";
      local_178.m_empty = false;
      local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
      local_168 = boost::unit_test::lazy_ostream::inst;
      local_160 = &local_188;
      local_1c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_1c0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_158,&local_178,1,0xe,WARN,(check_type)pPVar14,(size_t)&local_1c8,0x8a);
      boost::detail::shared_count::~shared_count(&local_158.m_message.pn);
      pvVar2 = ptr;
      if (pPVar14 ==
          local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        __n_00 = (long)pPVar14 - (long)this_00;
        if (__n_00 == 0x7ffffffffffffff8) {
          local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
          super__Vector_impl_data._M_start = this_00;
          local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
          super__Vector_impl_data._M_finish = pPVar14;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            uVar6 = std::__throw_length_error("vector::_M_realloc_insert");
            std::vector<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::~vector(&local_118);
            PoolResource<128UL,_8UL>::~PoolResource(&resource);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              _Unwind_Resume(uVar6);
            }
          }
          goto LAB_0043b829;
        }
        __p = (pointer)((long)__n_00 / 0x18);
        __n = (long)__n_00 % 0x18;
        pPVar4 = __p;
        if (this_00 == pPVar14) {
          pPVar4 = (pointer)&DAT_00000001;
        }
        puVar8 = (undefined1 *)((long)&__p->ptr + (long)&pPVar4->ptr);
        if ((undefined1 *)0x555555555555554 < puVar8) {
          puVar8 = (undefined1 *)0x555555555555555;
        }
        if (CARRY8((ulong)pPVar4,(ulong)__p)) {
          puVar8 = (undefined1 *)0x555555555555555;
        }
        if (puVar8 == (undefined1 *)0x0) {
          pPVar4 = (pointer)0x0;
        }
        else {
          pPVar4 = (pointer)operator_new((long)puVar8 * 0x18);
          __n = extraout_RDX;
        }
        (((_Vector_impl *)&pPVar4[(long)__p].ptr)->super__Vector_impl_data)._M_start =
             (pointer)pvVar2;
        pPVar4[(long)__p].bytes = (size_t)pPVar13;
        pPVar4[(long)__p].alignment = (size_t)pPVar12;
        if (0 < (long)__n_00) {
          memmove(pPVar4,this_00,__n_00);
          __n = extraout_RDX_00;
        }
        pPVar14 = (pointer)(__n_00 + (long)pPVar4);
        std::_Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>::_M_deallocate
                  ((_Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_> *)this_00,__p,
                   __n);
        local_118.super__Vector_base<PtrSizeAlignment,_std::allocator<PtrSizeAlignment>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pPVar4 + (long)puVar8;
      }
      else {
        (((_Vector_impl *)&pPVar14->ptr)->super__Vector_impl_data)._M_start = (pointer)ptr;
        pPVar14->bytes = (size_t)pPVar13;
        pPVar14->alignment = (size_t)pPVar12;
        pPVar4 = this_00;
      }
      pPVar14 = pPVar14 + 1;
      this_00 = pPVar4;
      goto LAB_0043b2e5;
    }
    iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                      (&this_01->super_RandomMixin<FastRandomContext>,4);
    if (iVar3 != 0) goto LAB_0043b307;
    uVar5 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&this_01->super_RandomMixin<FastRandomContext>,
                       ((long)pPVar14 - (long)this_00) / 0x18);
    PoolResource<128UL,_8UL>::Deallocate
              (&resource,(((_Vector_impl *)&this_00[uVar5].ptr)->super__Vector_impl_data)._M_start,
               (size_t)this_00[uVar5].bytes,(size_t)this_00[uVar5].alignment);
    this_00[uVar5].alignment = (size_t)pPVar14[-1].alignment;
    pPVar12 = pPVar14 + -1;
    pPVar13 = (pointer)pPVar14[-1].bytes;
    pPVar14 = pPVar14 + -1;
    (((_Vector_impl *)&this_00[uVar5].ptr)->super__Vector_impl_data)._M_start =
         (((_Vector_impl *)&pPVar12->ptr)->super__Vector_impl_data)._M_start;
    this_00[uVar5].bytes = (size_t)pPVar13;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(random_allocations)
{
    struct PtrSizeAlignment {
        void* ptr;
        size_t bytes;
        size_t alignment;
    };

    // makes a bunch of random allocations and gives all of them back in random order.
    auto resource = PoolResource<128, 8>(65536);
    std::vector<PtrSizeAlignment> ptr_size_alignment{};
    for (size_t i = 0; i < 1000; ++i) {
        // make it a bit more likely to allocate than deallocate
        if (ptr_size_alignment.empty() || 0 != m_rng.randrange(4)) {
            // allocate a random item
            std::size_t alignment = std::size_t{1} << m_rng.randrange(8);          // 1, 2, ..., 128
            std::size_t size = (m_rng.randrange(200) / alignment + 1) * alignment; // multiple of alignment
            void* ptr = resource.Allocate(size, alignment);
            BOOST_TEST(ptr != nullptr);
            BOOST_TEST((reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0);
            ptr_size_alignment.push_back({ptr, size, alignment});
        } else {
            // deallocate a random item
            auto& x = ptr_size_alignment[m_rng.randrange(ptr_size_alignment.size())];
            resource.Deallocate(x.ptr, x.bytes, x.alignment);
            x = ptr_size_alignment.back();
            ptr_size_alignment.pop_back();
        }
    }

    // deallocate all the rest
    for (auto const& x : ptr_size_alignment) {
        resource.Deallocate(x.ptr, x.bytes, x.alignment);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}